

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_test.cpp
# Opt level: O0

void __thiscall Hash_VarArgs_Test::TestBody(Hash_VarArgs_Test *this)

{
  AssertHelper *this_00;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  int i;
  int buf [4];
  char *in_stack_ffffffffffffff88;
  AssertionResult *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  AssertionResult local_30;
  int local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = 0xffffcf2100000001;
  local_10 = 0x2501df5e0d;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    pbrt::HashBuffer(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,0x5b72ac);
    this_00 = (AssertHelper *)pbrt::Hash<int>(0);
    in_stack_ffffffffffffff90 = &local_30;
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa0,
               (unsigned_long *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
               (unsigned_long *)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff9f =
         testing::AssertionResult::operator_cast_to_bool(in_stack_ffffffffffffff90);
    if (!(bool)in_stack_ffffffffffffff9f) {
      testing::Message::Message((Message *)this_00);
      in_stack_ffffffffffffff88 =
           testing::AssertionResult::failure_message((AssertionResult *)0x5b7333);
      testing::internal::AssertHelper::AssertHelper
                (this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
      testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff90);
      testing::Message::~Message((Message *)0x5b737f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b73bf);
  }
  return;
}

Assistant:

TEST(Hash, VarArgs) {
    int buf[] = {1, -12511, 31415821, 37};
    for (int i = 0; i < 4; ++i)
        EXPECT_EQ(HashBuffer(buf + i, sizeof(int)), Hash(buf[i]));
}